

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool test6(void)

{
  allocator<int> *this;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  reference piVar2;
  int *piVar3;
  bool local_1f2;
  int *x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_168 [12];
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  vector<int,_std::allocator<int>_> v2;
  int local_108 [34];
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> v1;
  undefined1 local_48 [8];
  queue<int> b;
  queue<int> a;
  
  CP::queue<int>::queue((queue<int> *)&b.mFront);
  CP::queue<int>::queue((queue<int> *)local_48);
  local_108[0x1c] = 0;
  local_108[0x1d] = 0;
  local_108[0x1e] = 0;
  local_108[0x1f] = 0;
  local_108[0x18] = 0;
  local_108[0x19] = 0;
  local_108[0x1a] = 0;
  local_108[0x1b] = 0;
  local_108[0x14] = 0;
  local_108[0x15] = 0;
  local_108[0x16] = 0;
  local_108[0x17] = 0;
  local_108[0x10] = 0;
  local_108[0x11] = 0;
  local_108[0x12] = 0;
  local_108[0x13] = 0;
  local_108[0xc] = 0;
  local_108[0xd] = 0;
  local_108[0xe] = 0;
  local_108[0xf] = 0;
  local_108[8] = 0;
  local_108[9] = 0;
  local_108[10] = 0;
  local_108[0xb] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[0x20] = 0;
  memcpy(local_108,&DAT_001080d8,0x84);
  local_78 = 0x21;
  this = (allocator<int> *)
         ((long)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage + 7);
  local_80 = local_108;
  std::allocator<int>::allocator(this);
  __l_00._M_len = local_78;
  __l_00._M_array = local_80;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,__l_00,this);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_168[4] = 4;
  local_168[5] = 2;
  local_168[6] = -3;
  local_168[7] = 9;
  local_168[0] = 0;
  local_168[1] = 0;
  local_168[2] = 1;
  local_168[3] = 5;
  local_168[8] = 6;
  local_138 = local_168;
  local_130 = 9;
  std::allocator<int>::allocator((allocator<int> *)((long)&__range1 + 7));
  __l._M_len = local_130;
  __l._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_128,__l,
             (allocator<int> *)((long)&__range1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&__range1 + 7));
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_70);
  x = (int *)std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_70);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&x), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    CP::queue<int>::push((queue<int> *)&b.mFront,piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_128);
  x_1 = (int *)std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_128);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            &x_1), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_1);
    CP::queue<int>::push((queue<int> *)local_48,piVar2);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  while (piVar3 = CP::queue<int>::front((queue<int> *)&b.mFront), *piVar3 == 0) {
    CP::queue<int>::pop((queue<int> *)&b.mFront);
  }
  while (piVar3 = CP::queue<int>::front((queue<int> *)local_48), *piVar3 == 0) {
    CP::queue<int>::pop((queue<int> *)local_48);
  }
  bVar1 = CP::queue<int>::operator==((queue<int> *)&b.mFront,(queue<int> *)local_48);
  local_1f2 = false;
  if (bVar1) {
    local_1f2 = CP::queue<int>::operator==((queue<int> *)local_48,(queue<int> *)&b.mFront);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_128);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  CP::queue<int>::~queue((queue<int> *)local_48);
  CP::queue<int>::~queue((queue<int> *)&b.mFront);
  return local_1f2;
}

Assistant:

bool test6() {
  CP::queue<int> a,b;
  std::vector<int> v1 = {0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1,5,4,2,-3,9,6};
  std::vector<int> v2 = {0,0,1,5,4,2,-3,9,6};
  for (auto &x : v1) { a.push(x); }
  for (auto &x : v2) { b.push(x); }
  while (a.front() == 0) a.pop();
  while (b.front() == 0) b.pop();
  return ( (a == b)   && (b == a) );
}